

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O1

void prt_map(void)

{
  uint uVar1;
  term *t;
  chunk_conflict *pcVar2;
  term *t_00;
  _Bool _Var3;
  int iVar4;
  loc lVar5;
  int iVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  int iVar11;
  long lVar12;
  wchar_t wVar13;
  int x;
  int iVar14;
  wchar_t tc;
  wchar_t c;
  wchar_t ta;
  wchar_t a;
  grid_data g;
  wchar_t local_7c;
  wchar_t local_70;
  wchar_t local_6c;
  wchar_t local_68;
  wchar_t local_64;
  long local_60;
  grid_data local_58;
  
  lVar12 = 0;
  do {
    t_00 = Term;
    t = angband_term[lVar12];
    if (t != (term *)0x0) {
      uVar1 = window_flag[lVar12];
      if ((uVar1 & 0xa0) != 0) {
        if ((uVar1 & 0x20) == 0) {
          iVar14 = t->hgt;
          iVar4 = iVar14 / (int)(uint)tile_height;
          wVar13 = L'\0';
          iVar7 = 0;
          if (-1 < (char)uVar1) {
            iVar7 = row_bottom_map[Term->sidebar_mode];
          }
          local_60 = lVar12;
          if (0 < iVar4) {
            iVar11 = t->offset_y;
            iVar4 = iVar4 + iVar11;
            iVar6 = t->wid / (int)(uint)tile_width + t->offset_x;
            wVar13 = L'\0';
            do {
              x = t->offset_x;
              wVar8 = L'\0';
              if (x < iVar6) {
                wVar8 = L'\0';
                do {
                  pcVar2 = cave;
                  lVar5 = (loc)loc(x,iVar11);
                  _Var3 = square_in_bounds(pcVar2,lVar5);
                  if (_Var3) {
                    lVar5 = (loc)loc(x,iVar11);
                    map_info(lVar5,&local_58);
                    grid_data_as_text(&local_58,&local_64,&local_6c,&local_68,&local_70);
                    Term_queue_char(t,wVar8,wVar13,local_64,local_6c,local_68,local_70);
                    if ((1 < tile_width) || (1 < tile_height)) {
                      wVar9 = L'ÿ';
                      wVar10 = L'\xffffffff';
LAB_001daab8:
                      Term_big_queue_char(t,wVar8,wVar13,iVar14 - iVar7,wVar9,wVar10,L'\0',L'\0');
                    }
                  }
                  else {
                    Term_queue_char(t,wVar8,wVar13,L'\x01',L' ',L'\0',L'\0');
                    if ((1 < tile_width) || (1 < tile_height)) {
                      wVar9 = L'\x01';
                      wVar10 = L' ';
                      goto LAB_001daab8;
                    }
                  }
                  wVar8 = wVar8 + (uint)tile_width;
                  x = x + 1;
                } while (iVar6 != x);
              }
              for (; wVar8 < t->wid; wVar8 = wVar8 + L'\x01') {
                Term_queue_char(t,wVar8,wVar13,L'\x01',L' ',L'\0',L'\0');
              }
              wVar13 = wVar13 + (uint)tile_height;
              iVar11 = iVar11 + 1;
            } while (iVar11 < iVar4);
          }
          lVar12 = local_60;
          if (wVar13 < t->hgt) {
            do {
              if (0 < t->wid) {
                wVar8 = L'\0';
                do {
                  Term_queue_char(t,wVar8,wVar13,L'\x01',L' ',L'\0',L'\0');
                  wVar8 = wVar8 + L'\x01';
                } while (wVar8 < t->wid);
              }
              wVar13 = wVar13 + L'\x01';
            } while (wVar13 < t->hgt);
          }
        }
        else {
          Term_activate(t);
          display_map((int *)0x0,(int *)0x0);
          Term_activate(t_00);
        }
      }
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      iVar14 = Term->sidebar_mode;
      local_7c = row_top_map[iVar14];
      iVar7 = Term->hgt - (row_bottom_map[iVar14] + local_7c);
      iVar4 = iVar7 / (int)(uint)tile_height;
      if (0 < iVar4) {
        iVar11 = Term->offset_y;
        iVar4 = iVar4 + iVar11;
        iVar14 = (~col_map[iVar14] + Term->wid) / (int)(uint)tile_width + Term->offset_x;
        wVar13 = iVar7 + local_7c;
        do {
          iVar7 = Term->offset_x;
          if (iVar7 < iVar14) {
            wVar8 = col_map[Term->sidebar_mode];
            do {
              pcVar2 = cave;
              lVar5 = (loc)loc(iVar7,iVar11);
              _Var3 = square_in_bounds(pcVar2,lVar5);
              if (_Var3) {
                lVar5 = (loc)loc(iVar7,iVar11);
                map_info(lVar5,&local_58);
                grid_data_as_text(&local_58,&local_64,&local_6c,&local_68,&local_70);
                wVar10 = local_64;
                wVar9 = local_6c;
                Term_queue_char(Term,wVar8,local_7c,local_64,local_6c,local_68,local_70);
                if ((1 < tile_width) || (1 < tile_height)) {
                  Term_big_queue_char(Term,wVar8,local_7c,wVar13,wVar10,wVar9,L'\x01',L' ');
                }
              }
              wVar8 = wVar8 + (uint)tile_width;
              iVar7 = iVar7 + 1;
            } while (iVar14 != iVar7);
          }
          local_7c = local_7c + (uint)tile_height;
          iVar11 = iVar11 + 1;
        } while (iVar11 < iVar4);
      }
      return;
    }
  } while( true );
}

Assistant:

void prt_map(void)
{
	int a, ta;
	wchar_t c, tc;
	struct grid_data g;

	int y, x;
	int vy, vx;
	int ty, tx;
	int clipy;

	/* Redraw map sub-windows */
	prt_map_aux();

	/* Assume screen */
	ty = Term->offset_y + SCREEN_HGT;
	tx = Term->offset_x + SCREEN_WID;

	/* Avoid overwriting the last row with padding for big tiles. */
	clipy = ROW_MAP + SCREEN_ROWS;

	/* Dump the map */
	for (y = Term->offset_y, vy = ROW_MAP; y < ty; vy += tile_height, y++)
		for (x = Term->offset_x, vx = COL_MAP; x < tx; vx += tile_width, x++) {
			/* Check bounds */
			if (!square_in_bounds(cave, loc(x, y))) continue;

			/* Determine what is there */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Hack -- Queue it */
			Term_queue_char(Term, vx, vy, a, c, ta, tc);

			if ((tile_width > 1) || (tile_height > 1))
				Term_big_queue_char(Term, vx, vy, clipy, a, c,
					COLOUR_WHITE, L' ');
		}
}